

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  char cVar1;
  char cVar2;
  short sVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiTableInstanceData *pIVar5;
  char *pcVar6;
  ulong uVar7;
  ImGuiTableColumn *pIVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  bool held;
  bool hovered;
  ImRect hit_rect;
  bool local_6e;
  bool local_6d;
  float local_6c;
  float local_68;
  float local_64;
  ImRect local_60;
  ImGuiContext *local_50;
  undefined1 local_48 [16];
  
  if ((table->Flags & 1) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Resizable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x475,"void ImGui::TableUpdateBorders(ImGuiTable *)");
  }
  local_50 = GImGui;
  sVar3 = table->InstanceCurrent;
  if (sVar3 == 0) {
    pIVar5 = &table->InstanceDataFirst;
  }
  else {
    if ((sVar3 < 1) || ((table->InstanceDataExtra).Size < (int)sVar3)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x74f,
                    "T &ImVector<ImGuiTableInstanceData>::operator[](int) [T = ImGuiTableInstanceData]"
                   );
    }
    pIVar5 = (table->InstanceDataExtra).Data + ((ulong)(uint)(int)sVar3 - 1);
  }
  if (0 < table->ColumnsCount) {
    local_68 = (table->OuterRect).Min.y;
    fVar10 = (table->OuterRect).Max.y;
    fVar11 = pIVar5->LastOuterHeight + local_68;
    uVar9 = -(uint)(fVar11 <= fVar10);
    local_48 = ZEXT416(uVar9 & (uint)fVar10 | ~uVar9 & (uint)fVar11);
    local_6c = pIVar5->LastFirstRowHeight + local_68;
    uVar7 = 0;
    do {
      if ((table->EnabledMaskByDisplayOrder >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00193791;
      pcVar6 = (table->DisplayOrderToIndex).Data + uVar7;
      if ((table->DisplayOrderToIndex).DataEnd <= pcVar6) {
        pcVar6 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_0019395b;
      }
      cVar1 = *pcVar6;
      if (((long)cVar1 < 0) ||
         (pIVar8 = (table->Columns).Data + cVar1, (table->Columns).DataEnd <= pIVar8)) {
LAB_0019392f:
        pcVar6 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0019395b:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                      ,599,pcVar6);
      }
      if ((((pIVar8->Flags & 0x40000020U) == 0) &&
          ((fVar10 = (float)local_48._0_4_, (table->Flags & 0x800) == 0 ||
           (fVar10 = local_6c, table->IsUsingHeaders != false)))) &&
         ((pIVar8->IsVisibleX != false || (table->LastResizedColumn == cVar1)))) {
        local_64 = fVar10;
        id = TableGetColumnResizeID(table,(int)cVar1,(int)table->InstanceCurrent);
        local_60.Min.x = pIVar8->MaxX + -4.0;
        local_60.Max.x = pIVar8->MaxX + 4.0;
        local_60.Min.y = local_68;
        local_60.Max.y = local_64;
        KeepAliveID(id);
        local_6d = false;
        local_6e = false;
        bVar4 = ButtonBehavior(&local_60,id,&local_6d,&local_6e,0x41910);
        if ((bVar4) && (bVar4 = IsMouseDoubleClicked(0), bVar4)) {
          TableSetColumnWidthAutoSingle(table,(int)cVar1);
          ClearActiveID();
          local_6d = false;
          local_6e = false;
        }
        if (local_6e == true) {
          if (table->LastResizedColumn == -1) {
            cVar2 = table->RightMostEnabledColumn;
            fVar10 = -3.4028235e+38;
            if ((long)cVar2 != -1) {
              if ((cVar2 < '\0') ||
                 (pIVar8 = (table->Columns).Data + cVar2, (table->Columns).DataEnd <= pIVar8))
              goto LAB_0019392f;
              fVar10 = pIVar8->MaxX;
            }
            table->ResizeLockMinContentsX2 = fVar10;
          }
          table->ResizedColumn = cVar1;
          table->InstanceInteracted = table->InstanceCurrent;
        }
        if (local_6d == true) {
          if (0.06 < local_50->HoveredIdTimer || local_6e != false) {
LAB_0019390a:
            table->HoveredColumnBorder = cVar1;
            SetMouseCursor(4);
          }
        }
        else if (local_6e != false) goto LAB_0019390a;
      }
LAB_00193791:
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)table->ColumnsCount);
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}